

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::updateTabBarGeometry(QMdiAreaPrivate *this)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  LayoutDirection LVar4;
  QWidget *pQVar5;
  QMdiAreaPrivate *in_RDI;
  long in_FS_OFFSET;
  int areaWidth;
  int areaHeight;
  QMdiArea *q;
  QRect tabBarRect;
  QSize tabBarSizeHint;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  QRect *in_stack_fffffffffffffef8;
  QAbstractScrollArea *in_stack_ffffffffffffff00;
  QWidget *in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff18;
  LayoutDirection direction;
  QWidget *in_stack_ffffffffffffff20;
  QWidget *in_stack_ffffffffffffff28;
  int local_a0;
  
  direction = (LayoutDirection)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->tabBar != (QMdiAreaTabBar *)0x0) {
    pQVar5 = (QWidget *)q_func(in_RDI);
    (**(code **)(*(long *)&(in_RDI->tabBar->super_QTabBar).super_QWidget + 0x70))();
    QWidget::height((QWidget *)0x60fbbb);
    if (((in_RDI->super_QAbstractScrollAreaPrivate).hbar != (QScrollBar *)0x0) &&
       (bVar2 = QWidget::isVisible((QWidget *)0x60fbe1), bVar2)) {
      QWidget::height((QWidget *)0x60fbf8);
    }
    local_a0 = QWidget::width((QWidget *)0x60fc11);
    if (((in_RDI->super_QAbstractScrollAreaPrivate).vbar != (QScrollBar *)0x0) &&
       (bVar2 = QWidget::isVisible((QWidget *)0x60fc37), bVar2)) {
      iVar3 = QWidget::width((QWidget *)0x60fc4e);
      local_a0 = local_a0 - iVar3;
    }
    QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    switch(in_RDI->tabPosition) {
    case North:
      QSize::height((QSize *)0x60fcc0);
      QAbstractScrollArea::setViewportMargins
                (in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (int)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
      ;
      QSize::height((QSize *)0x60fcea);
      QRect::QRect(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      break;
    case South:
      QSize::height((QSize *)0x60fd41);
      QAbstractScrollArea::setViewportMargins
                (in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (int)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0)
      ;
      QSize::height((QSize *)0x60fd69);
      QSize::height((QSize *)0x60fd8a);
      QRect::QRect(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff28 = pQVar5;
      break;
    case West:
      LVar4 = QWidget::layoutDirection((QWidget *)0x60feb5);
      if (LVar4 == LeftToRight) {
        QSize::width((QSize *)0x60fed4);
        QAbstractScrollArea::setViewportMargins
                  (in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                   (int)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   in_stack_fffffffffffffef0);
        in_stack_ffffffffffffff08 = pQVar5;
      }
      else {
        QSize::width((QSize *)0x60ff05);
        QAbstractScrollArea::setViewportMargins
                  ((QAbstractScrollArea *)pQVar5,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                   (int)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   in_stack_fffffffffffffef0);
      }
      QSize::width((QSize *)0x60ff27);
      QRect::QRect(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      break;
    case East:
      LVar4 = QWidget::layoutDirection((QWidget *)0x60fdd6);
      if (LVar4 == LeftToRight) {
        QSize::width((QSize *)0x60fdf5);
        QAbstractScrollArea::setViewportMargins
                  (in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                   (int)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   in_stack_fffffffffffffef0);
        in_stack_ffffffffffffff20 = pQVar5;
      }
      else {
        QSize::width((QSize *)0x60fe26);
        direction = (LayoutDirection)((ulong)pQVar5 >> 0x20);
        QAbstractScrollArea::setViewportMargins
                  (in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                   (int)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                   in_stack_fffffffffffffef0);
      }
      in_stack_ffffffffffffff14 = QSize::width((QSize *)0x60fe50);
      in_stack_ffffffffffffff14 = local_a0 - in_stack_ffffffffffffff14;
      QSize::width((QSize *)0x60fe69);
      QRect::QRect(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      in_stack_ffffffffffffff10 = local_a0;
    }
    pQVar5 = (QWidget *)in_RDI->tabBar;
    QWidget::layoutDirection((QWidget *)0x60ff81);
    QWidget::contentsRect(pQVar5);
    QStyle::visualRect(direction,
                       (QRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                       (QRect *)in_stack_ffffffffffffff08);
    QWidget::setGeometry(in_stack_ffffffffffffff28,(QRect *)in_stack_ffffffffffffff20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::updateTabBarGeometry()
{
    if (!tabBar)
        return;

    Q_Q(QMdiArea);
#if QT_CONFIG(tabwidget)
    Q_ASSERT(_q_tb_tabBarShapeFrom(tabShape, tabPosition) == tabBar->shape());
#endif
    const QSize tabBarSizeHint = tabBar->sizeHint();

    int areaHeight = q->height();
    if (hbar && hbar->isVisible())
        areaHeight -= hbar->height();

    int areaWidth = q->width();
    if (vbar && vbar->isVisible())
        areaWidth -= vbar->width();

    QRect tabBarRect;
#if QT_CONFIG(tabwidget)
    switch (tabPosition) {
    case QTabWidget::North:
        q->setViewportMargins(0, tabBarSizeHint.height(), 0, 0);
        tabBarRect = QRect(0, 0, areaWidth, tabBarSizeHint.height());
        break;
    case QTabWidget::South:
        q->setViewportMargins(0, 0, 0, tabBarSizeHint.height());
        tabBarRect = QRect(0, areaHeight - tabBarSizeHint.height(), areaWidth, tabBarSizeHint.height());
        break;
    case QTabWidget::East:
        if (q->layoutDirection() == Qt::LeftToRight)
            q->setViewportMargins(0, 0, tabBarSizeHint.width(), 0);
        else
            q->setViewportMargins(tabBarSizeHint.width(), 0, 0, 0);
        tabBarRect = QRect(areaWidth - tabBarSizeHint.width(), 0, tabBarSizeHint.width(), areaHeight);
        break;
    case QTabWidget::West:
        if (q->layoutDirection() == Qt::LeftToRight)
            q->setViewportMargins(tabBarSizeHint.width(), 0, 0, 0);
        else
            q->setViewportMargins(0, 0, tabBarSizeHint.width(), 0);
        tabBarRect = QRect(0, 0, tabBarSizeHint.width(), areaHeight);
        break;
    default:
        break;
    }
#endif // QT_CONFIG(tabwidget)

    tabBar->setGeometry(QStyle::visualRect(q->layoutDirection(), q->contentsRect(), tabBarRect));
}